

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSONArray * __thiscall JSON::JSONValue::getArrayValue(JSONValue *this)

{
  JSONValueType JVar1;
  ostream *poVar2;
  string local_30;
  JSONValue *local_10;
  JSONValue *this_local;
  
  local_10 = this;
  JVar1 = getType(this);
  if (JVar1 != ARRAY) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON array value from ");
    getTypeAsString_abi_cxx11_(&local_30,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_30);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (JSONArray *)this->data;
}

Assistant:

const JSONArray &JSONValue::getArrayValue() const {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=ARRAY)
	cerr << "Error requesting JSON array value from " << getTypeAsString() << endl;
#endif

	return *((JSONArray*)data);
}